

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O2

void __thiscall Prog::Prog(Prog *this,Theme *theme,ALLEGRO_DISPLAY *display)

{
  ulong uVar1;
  string *text;
  List *pLVar2;
  char *pcVar3;
  Label *pLVar4;
  Label *this_00;
  int iVar5;
  long lVar6;
  List *pLVar7;
  allocator<char> local_4f9;
  Label *local_4f8;
  List *local_4f0;
  List *local_4e8;
  List *local_4e0;
  Widget *local_4d8;
  Widget *local_4d0;
  Widget *local_4c8;
  Widget *local_4c0;
  Label *local_4b8;
  ulong local_4b0;
  Label local_4a8;
  List *images [3];
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Dialog::Dialog(&this->d,theme,display,0x14,0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"Memory",(allocator<char> *)&local_4a8);
  local_4c0 = &(this->memory_label).super_Widget;
  Label::Label((Label *)local_4c0,&local_370,true);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"Texture",(allocator<char> *)&local_4a8);
  local_4c8 = &(this->texture_label).super_Widget;
  Label::Label((Label *)local_4c8,&local_390,true);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"Source",(allocator<char> *)&local_4a8);
  local_4d0 = &(this->source_label).super_Widget;
  Label::Label((Label *)local_4d0,&local_3b0,false);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"Destination",(allocator<char> *)&local_4a8);
  local_4d8 = &(this->destination_label).super_Widget;
  Label::Label((Label *)local_4d8,&local_3d0,false);
  std::__cxx11::string::~string((string *)&local_3d0);
  local_4e0 = &this->source_image;
  List::List(local_4e0,0);
  local_4e8 = &this->destination_image;
  List::List(local_4e8,1);
  local_4f0 = &this->draw_mode;
  List::List(local_4f0,0);
  pLVar4 = (Label *)&this->field_0x2f0;
  lVar6 = 0;
  local_4f8 = pLVar4;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"",(allocator<char> *)&local_4a8);
    Label::Label(pLVar4,&local_50,true);
    std::__cxx11::string::~string((string *)&local_50);
    lVar6 = lVar6 + -0x60;
    pLVar4 = pLVar4 + 1;
  } while (lVar6 != -0x240);
  pLVar2 = (List *)&this->field_0x530;
  lVar6 = 0;
  pLVar7 = pLVar2;
  do {
    List::List(pLVar7,0);
    lVar6 = lVar6 + -0x58;
    pLVar7 = pLVar7 + 1;
  } while (lVar6 != -0x210);
  pLVar4 = (Label *)&this->field_0x740;
  lVar6 = 0;
  local_4b8 = pLVar4;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"",(allocator<char> *)&local_4a8);
    Label::Label(pLVar4,&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    lVar6 = lVar6 + -0x60;
    pLVar4 = pLVar4 + 1;
  } while (lVar6 != -0x120);
  lVar6 = 0x860;
  do {
    HSlider::HSlider((HSlider *)((long)&(this->d).theme + lVar6),0,1);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x920);
  lVar6 = 0x920;
  do {
    HSlider::HSlider((HSlider *)((long)&(this->d).theme + lVar6),0,1);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x9e0);
  lVar6 = 0x9e0;
  do {
    HSlider::HSlider((HSlider *)((long)&(this->d).theme + lVar6),0,1);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0xaa0);
  lVar6 = 0xaa0;
  do {
    HSlider::HSlider((HSlider *)((long)&(this->d).theme + lVar6),0,1);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0xb60);
  Dialog::add(&this->d,local_4c0,9,0,10,2);
  Dialog::add(&this->d,local_4c8,0,0,10,2);
  iVar5 = 1;
  Dialog::add(&this->d,local_4d0,1,0xf,6,2);
  Dialog::add(&this->d,local_4d8,7,0xf,6,2);
  images[0] = local_4e0;
  images[1] = local_4e8;
  images[2] = local_4f0;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    pLVar7 = images[lVar6];
    if (lVar6 == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"original",(allocator<char> *)&local_4a8);
      List::append_item(pLVar7,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"scaled",(allocator<char> *)&local_4a8);
      List::append_item(pLVar7,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      text = &local_170;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)text,"rotated",(allocator<char> *)&local_4a8);
      List::append_item(pLVar7,text);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Mysha",(allocator<char> *)&local_4a8);
      List::append_item(pLVar7,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Allegro",(allocator<char> *)&local_4a8);
      List::append_item(pLVar7,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Mysha (tinted)",(allocator<char> *)&local_4a8);
      List::append_item(pLVar7,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"Allegro (tinted)",(allocator<char> *)&local_4a8);
      List::append_item(pLVar7,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      text = &local_110;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)text,"Color",(allocator<char> *)&local_4a8);
      List::append_item(pLVar7,text);
    }
    std::__cxx11::string::~string((string *)text);
    Dialog::add(&this->d,&pLVar7->super_Widget,iVar5,0x10,4,6);
    iVar5 = iVar5 + 6;
  }
  iVar5 = 1;
  uVar1 = 0;
  while (uVar1 != 4) {
    pcVar3 = "Alpha";
    if ((uVar1 & 1) == 0) {
      pcVar3 = "Color";
    }
    local_4b0 = uVar1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,pcVar3,&local_4f9);
    Label::Label(&local_4a8,&local_190,false);
    pLVar4 = local_4f8;
    Label::operator=(local_4f8,&local_4a8);
    Label::~Label(&local_4a8);
    std::__cxx11::string::~string((string *)&local_190);
    Dialog::add(&this->d,&pLVar4->super_Widget,iVar5,0x17,3,2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"ONE",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"ZERO",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"ALPHA",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"INVERSE",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"SRC_COLOR",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"DEST_COLOR",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"INV_SRC_COLOR",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"INV_DEST_COLOR",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"CONST_COLOR",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"INV_CONST_COLOR",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    Dialog::add(&this->d,&pLVar2->super_Widget,iVar5,0x18,3,10);
    iVar5 = iVar5 + 3;
    pLVar2 = pLVar2 + 1;
    local_4f8 = local_4f8 + 1;
    uVar1 = local_4b0 + 1;
  }
  iVar5 = 0xd;
  pLVar4 = (Label *)0x470;
  for (lVar6 = 0x690; lVar6 != 0x740; lVar6 = lVar6 + 0x58) {
    pcVar3 = "Alpha op";
    if (lVar6 == 0x690) {
      pcVar3 = "Blend op";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,pcVar3,&local_4f9);
    Label::Label(&local_4a8,&local_350,false);
    this_00 = (Label *)((long)&(pLVar4->super_Widget)._vptr_Widget + (long)&(this->d).theme);
    local_4f8 = pLVar4;
    Label::operator=(this_00,&local_4a8);
    Label::~Label(&local_4a8);
    std::__cxx11::string::~string((string *)&local_350);
    Dialog::add(&this->d,(Widget *)this_00,iVar5,0x17,3,2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"ADD",(allocator<char> *)&local_4a8);
    pLVar2 = (List *)((long)&(this->d).theme + lVar6);
    List::append_item(pLVar2,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"SRC_MINUS_DEST",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"DEST_MINUS_SRC",(allocator<char> *)&local_4a8);
    List::append_item(pLVar2,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    Dialog::add(&this->d,(Widget *)pLVar2,iVar5,0x18,3,6);
    iVar5 = iVar5 + 3;
    pLVar4 = local_4f8 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Source tint/color RGBA",&local_4f9);
  Label::Label(&local_4a8,&local_3f0,true);
  pLVar4 = local_4b8;
  Label::operator=(local_4b8,&local_4a8);
  Label::~Label(&local_4a8);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"Dest tint/color RGBA",&local_4f9);
  Label::Label(&local_4a8,&local_410,true);
  Label::operator=((Label *)&this->field_0x7a0,&local_4a8);
  Label::~Label(&local_4a8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"Const color RGBA",&local_4f9);
  Label::Label(&local_4a8,&local_430,true);
  Label::operator=((Label *)&this->field_0x800,&local_4a8);
  Label::~Label(&local_4a8);
  std::__cxx11::string::~string((string *)&local_430);
  Dialog::add(&this->d,&pLVar4->super_Widget,1,0x22,5,1);
  Dialog::add(&this->d,(Widget *)&this->field_0x7a0,7,0x22,5,1);
  Dialog::add(&this->d,(Widget *)&this->field_0x800,0xd,0x22,5,1);
  local_4f8._0_4_ = 1;
  for (lVar6 = -0xc0; lVar6 != 0; lVar6 = lVar6 + 0x40) {
    HSlider::HSlider((HSlider *)&local_4a8,0xff,0xff);
    *(ulong *)(&this->field_0x941 + lVar6) =
         CONCAT17((undefined1)local_4a8.super_Widget.x2,local_4a8.super_Widget._33_7_);
    *(undefined8 *)((long)(&this->field_0x941 + lVar6) + 8) = local_4a8.super_Widget._41_8_;
    *(Dialog **)(&this->field_0x938 + lVar6) = local_4a8.super_Widget.dialog;
    *(ulong *)((long)(&this->field_0x938 + lVar6) + 8) =
         CONCAT71(local_4a8.super_Widget._33_7_,(undefined1)local_4a8.super_Widget.x1);
    *(undefined8 *)(&this->field_0x928 + lVar6) = local_4a8.super_Widget._8_8_;
    *(undefined8 *)((long)(&this->field_0x928 + lVar6) + 8) = local_4a8.super_Widget._16_8_;
    *(undefined8 *)(&this->field_0x954 + lVar6) = local_4a8._52_8_;
    HSlider::HSlider((HSlider *)&local_4a8,0xff,0xff);
    *(ulong *)(&this->field_0xa01 + lVar6) =
         CONCAT17((undefined1)local_4a8.super_Widget.x2,local_4a8.super_Widget._33_7_);
    *(undefined8 *)((long)(&this->field_0xa01 + lVar6) + 8) = local_4a8.super_Widget._41_8_;
    *(Dialog **)(&this->field_0x9f8 + lVar6) = local_4a8.super_Widget.dialog;
    *(ulong *)((long)(&this->field_0x9f8 + lVar6) + 8) =
         CONCAT71(local_4a8.super_Widget._33_7_,(undefined1)local_4a8.super_Widget.x1);
    *(undefined8 *)(&this->field_0x9e8 + lVar6) = local_4a8.super_Widget._8_8_;
    *(undefined8 *)((long)(&this->field_0x9e8 + lVar6) + 8) = local_4a8.super_Widget._16_8_;
    *(undefined8 *)(&this->field_0xa14 + lVar6) = local_4a8._52_8_;
    HSlider::HSlider((HSlider *)&local_4a8,0xff,0xff);
    *(ulong *)(&this->field_0xac1 + lVar6) =
         CONCAT17((undefined1)local_4a8.super_Widget.x2,local_4a8.super_Widget._33_7_);
    *(undefined8 *)((long)(&this->field_0xac1 + lVar6) + 8) = local_4a8.super_Widget._41_8_;
    *(Dialog **)(&this->field_0xab8 + lVar6) = local_4a8.super_Widget.dialog;
    *(ulong *)((long)(&this->field_0xab8 + lVar6) + 8) =
         CONCAT71(local_4a8.super_Widget._33_7_,(undefined1)local_4a8.super_Widget.x1);
    *(undefined8 *)(&this->field_0xaa8 + lVar6) = local_4a8.super_Widget._8_8_;
    *(undefined8 *)((long)(&this->field_0xaa8 + lVar6) + 8) = local_4a8.super_Widget._16_8_;
    *(undefined8 *)(&this->field_0xad4 + lVar6) = local_4a8._52_8_;
    HSlider::HSlider((HSlider *)&local_4a8,0xff,0xff);
    iVar5 = (int)local_4f8;
    *(ulong *)((long)&this[1].d.x_padding + lVar6 + 1) =
         CONCAT17((undefined1)local_4a8.super_Widget.x2,local_4a8.super_Widget._33_7_);
    *(undefined8 *)(&this[1].d.quit_requested + lVar6) = local_4a8.super_Widget._41_8_;
    *(Dialog **)((long)&this[1].d.grid_m + lVar6) = local_4a8.super_Widget.dialog;
    *(ulong *)((long)&this[1].d.x_padding + lVar6) =
         CONCAT71(local_4a8.super_Widget._33_7_,(undefined1)local_4a8.super_Widget.x1);
    *(undefined8 *)((long)&this[1].d.display + lVar6) = local_4a8.super_Widget._8_8_;
    *(undefined8 *)((long)&this[1].d.event_queue + lVar6) = local_4a8.super_Widget._16_8_;
    *(undefined8 *)
     ((long)&this[1].d.all_widgets.super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
             _M_node.super__List_node_base._M_next + lVar6 + 4) = local_4a8._52_8_;
    Dialog::add(&this->d,(Widget *)(&this->field_0x920 + lVar6),(int)local_4f8,0x23,5,1);
    Dialog::add(&this->d,(Widget *)(&this->field_0x9e0 + lVar6),iVar5,0x24,5,1);
    Dialog::add(&this->d,(Widget *)(&this->field_0xaa0 + lVar6),iVar5,0x25,5,1);
    Dialog::add(&this->d,(Widget *)((long)&this[1].d.theme + lVar6),iVar5,0x26,5,1);
    local_4f8._0_4_ = iVar5 + 6;
  }
  return;
}

Assistant:

Prog::Prog(const Theme & theme, ALLEGRO_DISPLAY *display) :
   d(Dialog(theme, display, 20, 40)),
   memory_label(Label("Memory")),
   texture_label(Label("Texture")),
   source_label(Label("Source", false)),
   destination_label(Label("Destination", false)),
   source_image(List(0)),
   destination_image(List(1)),
   draw_mode(List(0))
{
   d.add(memory_label, 9, 0, 10, 2);
   d.add(texture_label, 0, 0, 10, 2);
   d.add(source_label, 1, 15, 6, 2);
   d.add(destination_label, 7, 15, 6, 2);

   List *images[] = {&source_image, &destination_image, &draw_mode};
   for (int i = 0; i < 3; i++) {
      List & image = *images[i];
      if (i < 2) {
         image.append_item("Mysha");
         image.append_item("Allegro");
         image.append_item("Mysha (tinted)");
         image.append_item("Allegro (tinted)");
         image.append_item("Color");
      }
      else {
         image.append_item("original");
         image.append_item("scaled");
         image.append_item("rotated");
      }
      d.add(image, 1 + i * 6, 16, 4, 6);
   }

   for (int i = 0; i < 4; i++) {
      operation_label[i] = Label(i % 2 == 0 ? "Color" : "Alpha", false);
      d.add(operation_label[i], 1 + i * 3, 23, 3, 2);
      List &l = operations[i];
      l.append_item("ONE");
      l.append_item("ZERO");
      l.append_item("ALPHA");
      l.append_item("INVERSE");
      l.append_item("SRC_COLOR");
      l.append_item("DEST_COLOR");
      l.append_item("INV_SRC_COLOR");
      l.append_item("INV_DEST_COLOR");
      l.append_item("CONST_COLOR");
      l.append_item("INV_CONST_COLOR");
      d.add(l, 1 + i * 3, 24, 3, 10);
   }

   for (int i = 4; i < 6; i++) {
      operation_label[i] = Label(i == 4 ? "Blend op" : "Alpha op", false);
      d.add(operation_label[i], 1 + i * 3, 23, 3, 2);
      List &l = operations[i];
      l.append_item("ADD");
      l.append_item("SRC_MINUS_DEST");
      l.append_item("DEST_MINUS_SRC");
      d.add(l, 1 + i * 3, 24, 3, 6);
   }

   rgba_label[0] = Label("Source tint/color RGBA");
   rgba_label[1] = Label("Dest tint/color RGBA");
   rgba_label[2] = Label("Const color RGBA");
   d.add(rgba_label[0], 1, 34, 5, 1);
   d.add(rgba_label[1], 7, 34, 5, 1);
   d.add(rgba_label[2], 13, 34, 5, 1);

   for (int i = 0; i < 3; i++) {
      r[i] = HSlider(255, 255);
      g[i] = HSlider(255, 255);
      b[i] = HSlider(255, 255);
      a[i] = HSlider(255, 255);
      d.add(r[i], 1 + i * 6, 35, 5, 1);
      d.add(g[i], 1 + i * 6, 36, 5, 1);
      d.add(b[i], 1 + i * 6, 37, 5, 1);
      d.add(a[i], 1 + i * 6, 38, 5, 1);
   }
}